

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

float __thiscall pbrt::SampledGrid<float>::MaximumValue(SampledGrid<float> *this,Bounds3f *bounds)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  undefined4 in_register_00000014;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [60];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  Point3i local_98;
  undefined1 local_88 [16];
  int local_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ulong local_40;
  ulong local_38;
  undefined1 extraout_var_00 [60];
  
  auVar17._0_4_ = (float)this->nz;
  auVar17._4_12_ = in_ZMM0._4_12_;
  auVar15 = vfmadd132ss_fma(ZEXT416((uint)(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z),
                            SUB6416(ZEXT464(0xbf000000),0),auVar17);
  auVar16 = vfmadd132ss_fma(auVar17,SUB6416(ZEXT464(0xbf000000),0),
                            ZEXT416((uint)(bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z));
  auVar17 = vroundss_avx(auVar15,auVar15,9);
  uVar1 = this->nx;
  uVar4 = this->ny;
  local_68._4_4_ = uVar4;
  local_68._0_4_ = uVar1;
  local_68._8_8_ = 0;
  local_58 = vcvtdq2ps_avx(local_68);
  uVar2 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar5 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  auVar19._4_4_ = uVar5;
  auVar19._0_4_ = uVar2;
  auVar19._8_8_ = 0;
  uVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_70 = 0;
  auVar15._8_4_ = 0xbf000000;
  auVar15._0_8_ = 0xbf000000bf000000;
  auVar15._12_4_ = 0xbf000000;
  auVar15 = vfmadd213ps_avx512vl(auVar19,local_58,auVar15);
  auVar15 = vroundps_avx(auVar15,9);
  auVar20._0_4_ = (int)auVar15._0_4_;
  auVar20._4_4_ = (int)auVar15._4_4_;
  auVar20._8_4_ = (int)auVar15._8_4_;
  auVar20._12_4_ = (int)auVar15._12_4_;
  local_88 = vpmaxsd_avx(auVar20,ZEXT816(0) << 0x20);
  local_40 = (ulong)local_88._4_4_;
  uVar12 = ~((int)auVar17._0_4_ >> 0x1f) & (int)auVar17._0_4_;
  local_38 = CONCAT44(in_register_00000014,local_88._0_4_);
  local_98.super_Tuple3<pbrt::Point3,_int>._0_8_ =
       (local_40 << 0x20) + CONCAT44(in_register_00000014,local_88._0_4_);
  auVar15 = vroundss_avx(auVar16,auVar16,9);
  uVar8 = (int)auVar15._0_4_ + 1;
  uVar9 = this->nz - 1;
  if ((int)uVar8 <= (int)uVar9) {
    uVar9 = uVar8;
  }
  local_98.super_Tuple3<pbrt::Point3,_int>.z = uVar12;
  local_78 = uVar3;
  uStack_74 = uVar6;
  auVar22._0_4_ = Lookup(this,&local_98);
  auVar22._4_60_ = extraout_var;
  auVar15 = auVar22._0_16_;
  auVar22 = ZEXT1664(auVar15);
  if ((int)uVar12 <= (int)uVar9) {
    auVar17 = vpcmpeqd_avx(auVar15,auVar15);
    auVar15 = vpaddd_avx(auVar17,local_68);
    auVar7._4_4_ = uStack_74;
    auVar7._0_4_ = local_78;
    auVar7._8_8_ = uStack_70;
    auVar16._8_4_ = 0xbf000000;
    auVar16._0_8_ = 0xbf000000bf000000;
    auVar16._12_4_ = 0xbf000000;
    auVar16 = vfmadd213ps_avx512vl(local_58,auVar7,auVar16);
    auVar16 = vroundps_avx(auVar16,9);
    auVar21._0_4_ = (int)auVar16._0_4_;
    auVar21._4_4_ = (int)auVar16._4_4_;
    auVar21._8_4_ = (int)auVar16._8_4_;
    auVar21._12_4_ = (int)auVar16._12_4_;
    auVar17 = vpsubd_avx(auVar21,auVar17);
    auVar17 = vpminsd_avx(auVar15,auVar17);
    uVar11 = vpcmpd_avx512vl(auVar17,local_88,1);
    local_88._0_4_ = (int)((uVar11 & 0xf) >> 1);
    local_68._0_4_ = (int)(uVar11 & 0xf);
    local_78 = auVar17._4_4_;
    do {
      uVar11 = local_40;
      if ((local_88 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        do {
          uVar13 = local_38 & 0xffffffff;
          iVar10 = (int)uVar11;
          if ((local_68 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            do {
              local_58._0_4_ = auVar22._0_4_;
              local_98.super_Tuple3<pbrt::Point3,_int>.y = iVar10;
              local_98.super_Tuple3<pbrt::Point3,_int>.x = (int)uVar13;
              local_98.super_Tuple3<pbrt::Point3,_int>.z = uVar12;
              auVar18._0_4_ = Lookup(this,&local_98);
              auVar18._4_60_ = extraout_var_00;
              auVar15 = vmaxss_avx(auVar18._0_16_,ZEXT416((uint)local_58._0_4_));
              auVar22 = ZEXT1664(auVar15);
              uVar8 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar8;
            } while (auVar17._0_4_ + 1U != uVar8);
          }
          uVar11 = (ulong)(iVar10 + 1);
        } while (iVar10 != local_78);
      }
      auVar15 = auVar22._0_16_;
      bVar14 = uVar12 != uVar9;
      uVar12 = uVar12 + 1;
    } while (bVar14);
  }
  return auVar15._0_4_;
}

Assistant:

T MaximumValue(const Bounds3f &bounds) const {
        Point3f ps[2] = {Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                                 bounds.pMin.z * nz - .5f),
                         Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                                 bounds.pMax.z * nz - .5f)};
        Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                         Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                             Point3i(nx - 1, ny - 1, nz - 1))};

        T maxValue = Lookup(Point3i(pi[0]));
        for (int z = pi[0].z; z <= pi[1].z; ++z)
            for (int y = pi[0].y; y <= pi[1].y; ++y)
                for (int x = pi[0].x; x <= pi[1].x; ++x) {
                    using std::max;
                    maxValue = max(maxValue, Lookup(Point3i(x, y, z)));
                }

        return maxValue;
    }